

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TagExtracter::~TagExtracter(TagExtracter *this)

{
  ~TagExtracter(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TagExtracter::~TagExtracter() {}